

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_telltc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t *pwVar1;
  char *pcVar2;
  char *local_38;
  char *ub;
  char **ts;
  termcapstr *t;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  fprintf((FILE *)el->el_outfile,"\n\tYour terminal has the\n");
  fprintf((FILE *)el->el_outfile,"\tfollowing characteristics:\n\n");
  fprintf((FILE *)el->el_outfile,"\tIt has %d columns and %d lines\n",
          (ulong)(uint)(el->el_terminal).t_val[3],(ulong)(uint)(el->el_terminal).t_val[2]);
  pcVar2 = "no";
  if (((el->el_terminal).t_flags & 0x40U) != 0) {
    pcVar2 = "a";
  }
  fprintf((FILE *)el->el_outfile,"\tIt has %s meta key\n",pcVar2);
  pcVar2 = "not ";
  if (((el->el_terminal).t_flags & 8U) != 0) {
    pcVar2 = " ";
  }
  fprintf((FILE *)el->el_outfile,"\tIt can%suse tabs\n",pcVar2);
  pcVar2 = "does not have";
  if (((el->el_terminal).t_flags & 0x80U) != 0) {
    pcVar2 = "has";
  }
  fprintf((FILE *)el->el_outfile,"\tIt %s automatic margins\n",pcVar2);
  if (((el->el_terminal).t_flags & 0x80U) != 0) {
    pcVar2 = "does not have";
    if (((el->el_terminal).t_flags & 0x100U) != 0) {
      pcVar2 = "has";
    }
    fprintf((FILE *)el->el_outfile,"\tIt %s magic margins\n",pcVar2);
  }
  ts = &tstr[0].name;
  ub = (char *)(el->el_terminal).t_str;
  for (; *ts != (char *)0x0; ts = ts + 2) {
    if ((*(long *)ub == 0) || (**(char **)ub == '\0')) {
      local_38 = "(empty)";
    }
    else {
      pwVar1 = ct_decode_string(*(char **)ub,&el->el_scratch);
      pwVar1 = ct_visual_string(pwVar1,&el->el_visual);
      local_38 = ct_encode_string(pwVar1,&el->el_scratch);
    }
    fprintf((FILE *)el->el_outfile,"\t%25s (%s) == %s\n",ts[1],*ts,local_38);
    ub = ub + 8;
  }
  fputc(10,(FILE *)el->el_outfile);
  return L'\0';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_telltc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv __attribute__((__unused__)))
{
	const struct termcapstr *t;
	char **ts;

	(void) fprintf(el->el_outfile, "\n\tYour terminal has the\n");
	(void) fprintf(el->el_outfile, "\tfollowing characteristics:\n\n");
	(void) fprintf(el->el_outfile, "\tIt has %d columns and %d lines\n",
	    Val(T_co), Val(T_li));
	(void) fprintf(el->el_outfile,
	    "\tIt has %s meta key\n", EL_HAS_META ? "a" : "no");
	(void) fprintf(el->el_outfile,
	    "\tIt can%suse tabs\n", EL_CAN_TAB ? " " : "not ");
	(void) fprintf(el->el_outfile, "\tIt %s automatic margins\n",
	    EL_HAS_AUTO_MARGINS ? "has" : "does not have");
	if (EL_HAS_AUTO_MARGINS)
		(void) fprintf(el->el_outfile, "\tIt %s magic margins\n",
		    EL_HAS_MAGIC_MARGINS ? "has" : "does not have");

	for (t = tstr, ts = el->el_terminal.t_str; t->name != NULL; t++, ts++) {
		const char *ub;
		if (*ts && **ts) {
			ub = ct_encode_string(ct_visual_string(
			    ct_decode_string(*ts, &el->el_scratch),
			    &el->el_visual), &el->el_scratch);
		} else {
			ub = "(empty)";
		}
		(void) fprintf(el->el_outfile, "\t%25s (%s) == %s\n",
		    t->long_name, t->name, ub);
	}
	(void) fputc('\n', el->el_outfile);
	return 0;
}